

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void Wavegeneral_h(Mat *a,int JJ,int n,int isign,double *P,double *Q,int fsize)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  undefined8 uVar13;
  double dVar14;
  
  if (fsize <= n) {
    uVar7 = n >> 1;
    if (isign < 0) {
      if (n < 1) {
        return;
      }
      iVar4 = uVar7 - fsize / 2;
      iVar3 = *(int *)(a + 0xc);
      lVar1 = *(long *)(a + 0x10);
      plVar2 = *(long **)(a + 0x48);
      uVar8 = 0;
      do {
        iVar4 = iVar4 + 1;
        (Wavegeneral_h::b + uVar8)[0] = 0.0;
        (Wavegeneral_h::b + uVar8)[1] = 0.0;
        if (1 < fsize) {
          lVar10 = *plVar2 * (long)JJ + lVar1;
          uVar13 = 0;
          lVar11 = (ulong)(uint)fsize + 2;
          iVar9 = iVar4;
          do {
            iVar5 = (int)((long)((ulong)(uint)((int)((long)iVar9 % (long)iVar3) >> 0x1f) << 0x20 |
                                (long)iVar9 % (long)iVar3 & 0xffffffffU) % (long)(int)uVar7);
            dVar12 = (double)*(float *)(lVar10 + (long)iVar5 * 4);
            dVar14 = (double)*(float *)(lVar10 + (long)(int)(iVar5 + uVar7) * 4);
            uVar13 = CONCAT44((float)(dVar12 * (P + lVar11 + -4)[1] + dVar14 * (Q + lVar11 + -4)[1]
                                     + (double)(float)((ulong)uVar13 >> 0x20)),
                              (float)(dVar12 * P[lVar11 + -4] + dVar14 * Q[lVar11 + -4] +
                                     (double)(float)uVar13));
            lVar11 = lVar11 + -2;
            iVar9 = iVar9 + 1;
          } while (3 < lVar11);
          *(undefined8 *)(Wavegeneral_h::b + uVar8) = uVar13;
        }
        uVar8 = uVar8 + 2;
      } while (uVar8 < (uint)n);
    }
    else {
      if (n < 1) {
        return;
      }
      lVar1 = *(long *)(a + 0x10);
      plVar2 = *(long **)(a + 0x48);
      uVar8 = 0;
      iVar3 = 0;
      do {
        lVar11 = uVar7 + uVar8;
        Wavegeneral_h::b[uVar8] = 0.0;
        Wavegeneral_h::b[lVar11] = 0.0;
        if (0 < fsize) {
          lVar10 = *plVar2;
          uVar6 = 0;
          do {
            dVar12 = (double)*(float *)(lVar10 * JJ + lVar1 +
                                       ((ulong)(uint)(iVar3 + (int)uVar6) % (ulong)(uint)n) * 4);
            Wavegeneral_h::b[uVar8] = (float)(P[uVar6] * dVar12 + (double)Wavegeneral_h::b[uVar8]);
            Wavegeneral_h::b[lVar11] = (float)(dVar12 * Q[uVar6] + (double)Wavegeneral_h::b[lVar11])
            ;
            uVar6 = uVar6 + 1;
          } while ((uint)fsize != uVar6);
        }
        iVar3 = iVar3 + 2;
        uVar8 = uVar8 + 1;
      } while (uVar8 != (n - 1U >> 1) + 1);
    }
    if (0 < n) {
      memcpy((void *)((long)JJ * **(long **)(a + 0x48) + *(long *)(a + 0x10)),Wavegeneral_h::b,
             (ulong)(uint)n << 2);
      return;
    }
  }
  return;
}

Assistant:

static void 
Wavegeneral_h(cv::Mat& a, int JJ, int n, int isign, double *P, double *Q, int fsize)
{
  static float b[1024];
	
  if (n < fsize) return;
  int nh = n >> 1;
	
  if (isign >= 0) 
  {
    for (int i = 0,j = 0; j < n; j+=2, ++i) 
    {
      b[i]=0.0f; b[i+nh]=0.0f;
      for(int k = 0;k < fsize; ++k) 
      {
        b[i] += P[k] * a.at<float>(JJ, (j+k)%n);
        b[i+nh] += Q[k] * a.at<float>(JJ, (j+k)%n);
      }
    }
  } 
  else 
  {
    for (int i = 0, r = nh-(fsize/2-1); i < n; r+=1, i+=2) 
    {
      b[i]=0.0f;
      b[i+1]=0.0f;
			
      for(int k = fsize-2, j = 0; k >= 0; k-=2, j+=1) 
      {
        b[i] += P[k] * a.at<float>(JJ, ((r+j)%a.cols)%nh) + Q[k] * a.at<float>(JJ, nh+((r+j)%a.cols)%nh);
        b[i+1] += P[k+1] * a.at<float>(JJ, ((r+j)%a.cols)%nh) + Q[k+1] * a.at<float>(JJ, nh+((r+j)%a.cols)%nh);
      }
    }
  }
	
  for(int i = 0; i < n; ++i)
    a.at<float>(JJ, i) = b[i];
}